

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>::
operator()(deleter<pstore::json::details::matcher<pstore::json::null_output>_> *this,
          matcher<pstore::json::null_output> *p)

{
  matcher<pstore::json::null_output> *p_local;
  deleter<pstore::json::details::matcher<pstore::json::null_output>_> *this_local;
  
  if ((this->delete_ & 1U) == 0) {
    if (p != (matcher<pstore::json::null_output> *)0x0) {
      (**p->_vptr_matcher)();
    }
  }
  else if (p != (matcher<pstore::json::null_output> *)0x0) {
    (*p->_vptr_matcher[1])();
  }
  return;
}

Assistant:

void operator() (T * const p) const noexcept {
                    if (delete_) {
                        delete p;
                    } else {
                        // this instance of T is in unowned memory: call the destructor but don't
                        // try to free the storage.
                        if (p) {
                            p->~T ();
                        }
                    }
                }